

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabBestIndexMethod(sqlite3_vtab *pUnused,sqlite3_index_info *pInfo)

{
  char cVar1;
  sqlite3_index_constraint *psVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  
  uVar3 = (uint)pInfo->colUsed;
  uVar10 = 0;
  uVar8 = (ulong)(uint)pInfo->nConstraint;
  if (pInfo->nConstraint < 1) {
    uVar8 = uVar10;
  }
  uVar7 = 0xffffffff;
  lVar11 = 5;
  uVar5 = 0xffffffff;
  uVar4 = uVar5;
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    psVar2 = pInfo->aConstraint;
    if ((*(char *)((long)&psVar2->iColumn + lVar11) != '\0') &&
       (*(int *)((long)psVar2 + lVar11 + -5) == 0)) {
      cVar1 = *(char *)((long)psVar2 + lVar11 + -1);
      uVar9 = (uint)uVar10;
      if (cVar1 == '\x02') {
        uVar7 = uVar10 & 0xffffffff;
      }
      if ((cVar1 - 8U & 0xf7) == 0) {
        uVar4 = uVar9;
      }
      if (cVar1 == ' ') {
        uVar5 = uVar9;
      }
      if (cVar1 == '\x04') {
        uVar5 = uVar9;
      }
    }
    lVar11 = lVar11 + 0xc;
  }
  if ((int)uVar7 < 0) {
    pInfo->estimatedCost = 1000000.0;
    if ((int)uVar5 < 0) {
      iVar6 = 1;
      dVar12 = 500000.0;
    }
    else {
      uVar3 = uVar3 | 0x200;
      pInfo->aConstraintUsage[uVar5].argvIndex = 1;
      pInfo->estimatedCost = 500000.0;
      iVar6 = 2;
      dVar12 = 250000.0;
    }
    if (-1 < (int)uVar4) {
      uVar3 = uVar3 | 0x400;
      pInfo->aConstraintUsage[uVar4].argvIndex = iVar6;
      pInfo->estimatedCost = dVar12;
    }
  }
  else {
    uVar3 = uVar3 | 0x100;
    pInfo->aConstraintUsage[uVar7].argvIndex = 1;
    pInfo->estimatedCost = 100.0;
  }
  if (((pInfo->nOrderBy == 1) && (pInfo->aOrderBy->iColumn == 0)) && (pInfo->aOrderBy->desc == '\0')
     ) {
    pInfo->orderByConsumed = 1;
  }
  pInfo->idxNum = uVar3;
  return 0;
}

Assistant:

static int fts5VocabBestIndexMethod(
  sqlite3_vtab *pUnused,
  sqlite3_index_info *pInfo
){
  int i;
  int iTermEq = -1;
  int iTermGe = -1;
  int iTermLe = -1;
  int idxNum = (int)pInfo->colUsed;
  int nArg = 0;

  UNUSED_PARAM(pUnused);

  assert( (pInfo->colUsed & FTS5_VOCAB_COLUSED_MASK)==pInfo->colUsed );

  for(i=0; i<pInfo->nConstraint; i++){
    struct sqlite3_index_constraint *p = &pInfo->aConstraint[i];
    if( p->usable==0 ) continue;
    if( p->iColumn==0 ){          /* term column */
      if( p->op==SQLITE_INDEX_CONSTRAINT_EQ ) iTermEq = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LE ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_LT ) iTermLe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GE ) iTermGe = i;
      if( p->op==SQLITE_INDEX_CONSTRAINT_GT ) iTermGe = i;
    }
  }

  if( iTermEq>=0 ){
    idxNum |= FTS5_VOCAB_TERM_EQ;
    pInfo->aConstraintUsage[iTermEq].argvIndex = ++nArg;
    pInfo->estimatedCost = 100;
  }else{
    pInfo->estimatedCost = 1000000;
    if( iTermGe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_GE;
      pInfo->aConstraintUsage[iTermGe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
    if( iTermLe>=0 ){
      idxNum |= FTS5_VOCAB_TERM_LE;
      pInfo->aConstraintUsage[iTermLe].argvIndex = ++nArg;
      pInfo->estimatedCost = pInfo->estimatedCost / 2;
    }
  }

  /* This virtual table always delivers results in ascending order of
  ** the "term" column (column 0). So if the user has requested this
  ** specifically - "ORDER BY term" or "ORDER BY term ASC" - set the
  ** sqlite3_index_info.orderByConsumed flag to tell the core the results
  ** are already in sorted order.  */
  if( pInfo->nOrderBy==1
   && pInfo->aOrderBy[0].iColumn==0
   && pInfo->aOrderBy[0].desc==0
  ){
    pInfo->orderByConsumed = 1;
  }

  pInfo->idxNum = idxNum;
  return SQLITE_OK;
}